

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AttitudeQuaternionEKF.cpp
# Opt level: O0

bool __thiscall iDynTree::AttitudeQuaternionEKF::callEkfUpdate(AttitudeQuaternionEKF *this)

{
  bool bVar1;
  Span<double,__1L> *this_00;
  pointer ptr;
  long in_RDI;
  AttitudeQuaternionEKF *in_stack_00000050;
  Span<double,__1L> x_span;
  bool ok;
  Span<double,__1L> y_span;
  DiscreteExtendedKalmanFilterHelper *in_stack_000004f8;
  pointer in_stack_ffffffffffffff48;
  undefined7 in_stack_ffffffffffffff60;
  undefined1 in_stack_ffffffffffffff67;
  undefined1 uVar2;
  DiscreteExtendedKalmanFilterHelper *in_stack_ffffffffffffff68;
  undefined8 local_90;
  undefined8 local_88;
  Rotation local_80 [64];
  AttitudeQuaternionEKF *in_stack_ffffffffffffffc0;
  bool local_1;
  
  serializeMeasurementVector(in_stack_ffffffffffffffc0);
  this_00 = (Span<double,__1L> *)iDynTree::VectorDynSize::data();
  iDynTree::VectorDynSize::size();
  Span<double,_-1L>::Span(this_00,in_stack_ffffffffffffff48,0x62184d);
  local_1 = DiscreteExtendedKalmanFilterHelper::ekfSetMeasurementVector
                      (in_stack_ffffffffffffff68,
                       (Span<double,__1L> *)
                       CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60));
  bVar1 = DiscreteExtendedKalmanFilterHelper::ekfUpdate(in_stack_000004f8);
  if (!bVar1) {
    local_1 = false;
  }
  uVar2 = local_1;
  ptr = (pointer)iDynTree::VectorDynSize::data();
  iDynTree::VectorDynSize::size();
  Span<double,_-1L>::Span(this_00,ptr,0x6218db);
  bVar1 = DiscreteExtendedKalmanFilterHelper::ekfGetStates
                    (in_stack_ffffffffffffff68,
                     (Span<double,__1L> *)CONCAT17(uVar2,in_stack_ffffffffffffff60));
  if (bVar1) {
    deserializeStateVector(in_stack_00000050);
    iDynTree::Rotation::RotationFromQuaternion(local_80,(VectorFixSize *)(in_RDI + 0x1f0));
    iDynTree::Rotation::operator=((Rotation *)(in_RDI + 0x2e0),local_80);
    iDynTree::Rotation::asRPY();
    *(DiscreteExtendedKalmanFilterHelper **)(in_RDI + 0x328) = in_stack_ffffffffffffff68;
    *(undefined8 *)(in_RDI + 0x330) = local_90;
    *(undefined8 *)(in_RDI + 0x338) = local_88;
  }
  else {
    iDynTree::reportError
              ("AttitudeQuaternionEKF","updateFilterWithMeasurements",
               "could not get recent state estimate");
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool iDynTree::AttitudeQuaternionEKF::callEkfUpdate()
{
    serializeMeasurementVector();
    iDynTree::Span<double> y_span(m_y.data(), m_y.size());
    bool ok = ekfSetMeasurementVector(y_span);
    ok = ekfUpdate() && ok;

    iDynTree::Span<double> x_span(m_x.data(), m_x.size());
    if (ekfGetStates(x_span))
    {
        deserializeStateVector();
        m_orientationInSO3 = iDynTree::Rotation::RotationFromQuaternion(m_state_qekf.m_orientation);
        m_orientationInRPY = m_orientationInSO3.asRPY();
    }
    else
    {
        iDynTree::reportError("AttitudeQuaternionEKF", "updateFilterWithMeasurements", "could not get recent state estimate");
        return false;
    }
    return ok;
}